

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_tests.cpp
# Opt level: O3

void __thiscall
random_tests::fastrandom_tests_nondeterministic::test_method
          (fastrandom_tests_nondeterministic *this)

{
  void *pvVar1;
  int iVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  iterator in_R8;
  iterator pvVar5;
  iterator in_R9;
  iterator pvVar6;
  long in_FS_OFFSET;
  readonly_property<bool> rVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  Span<std::byte> output;
  Span<std::byte> output_00;
  const_string file_13;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  uint256 ret_1;
  uint256 ret;
  FastRandomContext ctx4;
  FastRandomContext ctx3;
  check_type cVar10;
  undefined1 *local_490;
  undefined1 *local_488;
  char *local_480;
  char *local_478;
  char *local_470;
  char *local_468;
  char *local_460;
  char *local_458;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_450;
  char **local_438;
  assertion_result local_430;
  undefined1 *local_418;
  undefined1 *local_410;
  char *local_408;
  char *local_400;
  char *local_3f8;
  char *local_3f0;
  undefined1 *local_3e8;
  undefined1 *local_3e0;
  char *local_3d8;
  char *local_3d0;
  char *local_3c8;
  char *local_3c0;
  undefined1 *local_3b8;
  undefined1 *local_3b0;
  char *local_3a8;
  char *local_3a0;
  char *local_398;
  char *local_390;
  undefined1 *local_388;
  undefined1 *local_380;
  char *local_378;
  char *local_370;
  char *local_368;
  char *local_360;
  undefined1 *local_358;
  undefined1 *local_350;
  char *local_348;
  char *local_340;
  char *local_338;
  char *local_330;
  undefined1 *local_328;
  undefined1 *local_320;
  char *local_318;
  char *local_310;
  char *local_308;
  char *local_300;
  undefined1 *local_2f8;
  undefined1 *local_2f0;
  char *local_2e8;
  char *local_2e0;
  char *local_2d8;
  char *local_2d0;
  undefined1 *local_2c8;
  undefined1 *local_2c0;
  char *local_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  undefined1 *local_298;
  undefined1 *local_290;
  char *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  undefined1 *local_268;
  undefined1 *local_260;
  char *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  undefined1 *local_238;
  undefined1 *local_230;
  char *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  undefined1 *local_208;
  undefined1 *local_200;
  char *local_1f8;
  char *local_1f0;
  char *local_1e8;
  char *local_1e0;
  undefined1 *local_1d8;
  undefined1 *local_1d0;
  char *local_1c8;
  char *local_1c0;
  char *local_1b8;
  char *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  char *local_198;
  char *local_190;
  assertion_result local_188;
  char cStack_170;
  char cStack_16f;
  char cStack_16e;
  char cStack_16d;
  char cStack_16c;
  char cStack_16b;
  char cStack_16a;
  char cStack_169;
  undefined1 local_168 [8];
  bool bStack_160;
  char cStack_15f;
  char cStack_15e;
  char cStack_15d;
  char cStack_15c;
  char cStack_15b;
  char cStack_15a;
  char cStack_159;
  shared_count sStack_158;
  char cStack_150;
  char cStack_14f;
  char cStack_14e;
  char cStack_14d;
  char cStack_14c;
  char cStack_14b;
  char cStack_14a;
  char cStack_149;
  undefined1 local_148 [16];
  undefined1 *local_138;
  assertion_result *local_130;
  FastRandomContext local_c0;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_198 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_190 = "";
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x55;
  file.m_begin = (iterator)&local_198;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_1a8,msg);
  FastRandomContext::FastRandomContext(&local_c0,false);
  uVar3 = FastRandomContext::rand64(&local_c0);
  local_168[0] = (class_property<bool>)(uVar3 != 0x817c4df1d77c8518);
  bStack_160 = false;
  cStack_15f = 0;
  cStack_15e = 0;
  cStack_15d = 0;
  cStack_15c = 0;
  cStack_15b = 0;
  cStack_15a = 0;
  cStack_159 = 0;
  sStack_158.pi_._0_1_ = 0;
  sStack_158.pi_._1_1_ = 0;
  sStack_158.pi_._2_1_ = 0;
  sStack_158.pi_._3_1_ = 0;
  sStack_158.pi_._4_1_ = 0;
  sStack_158.pi_._5_1_ = 0;
  sStack_158.pi_._6_1_ = 0;
  sStack_158.pi_._7_1_ = 0;
  local_188.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x28;
  local_188._1_1_ = 0x28;
  local_188._2_1_ = 0xec;
  local_188._3_1_ = 0;
  local_188._4_1_ = 0;
  local_188._5_1_ = 0;
  local_188._6_1_ = 0;
  local_188._7_1_ = 0;
  local_188.m_message.px._0_1_ = 0x6e;
  local_188.m_message.px._1_1_ = 0x28;
  local_188.m_message.px._2_1_ = 0xec;
  local_188.m_message.px._3_1_ = 0;
  local_188.m_message.px._4_1_ = 0;
  local_188.m_message.px._5_1_ = 0;
  local_188.m_message.px._6_1_ = 0;
  local_188.m_message.px._7_1_ = 0;
  local_148[8] = false;
  local_148._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_138 = boost::unit_test::lazy_ostream::inst;
  local_1b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_1b0 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  local_130 = &local_188;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_168,(lazy_ostream *)local_148,1,0,WARN,_cVar10,
             (size_t)&local_1b8,0x55);
  boost::detail::shared_count::~shared_count(&sStack_158);
  ChaCha20::~ChaCha20(&local_c0.rng);
  local_1c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_1c0 = "";
  local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x56;
  file_00.m_begin = (iterator)&local_1c8;
  msg_00.m_end = pvVar6;
  msg_00.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_1d8,
             msg_00);
  FastRandomContext::FastRandomContext(&local_c0,false);
  uVar3 = RandomMixin<FastRandomContext>::randbits<31>
                    (&local_c0.super_RandomMixin<FastRandomContext>);
  local_168[0] = (class_property<bool>)((int)uVar3 != 0x24e40c69);
  bStack_160 = false;
  cStack_15f = 0;
  cStack_15e = 0;
  cStack_15d = 0;
  cStack_15c = 0;
  cStack_15b = 0;
  cStack_15a = 0;
  cStack_159 = 0;
  sStack_158.pi_._0_1_ = 0;
  sStack_158.pi_._1_1_ = 0;
  sStack_158.pi_._2_1_ = 0;
  sStack_158.pi_._3_1_ = 0;
  sStack_158.pi_._4_1_ = 0;
  sStack_158.pi_._5_1_ = 0;
  sStack_158.pi_._6_1_ = 0;
  sStack_158.pi_._7_1_ = 0;
  local_188.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x6f;
  local_188._1_1_ = 0x28;
  local_188._2_1_ = 0xec;
  local_188._3_1_ = 0;
  local_188._4_1_ = 0;
  local_188._5_1_ = 0;
  local_188._6_1_ = 0;
  local_188._7_1_ = 0;
  local_188.m_message.px._0_1_ = 0xa0;
  local_188.m_message.px._1_1_ = 0x28;
  local_188.m_message.px._2_1_ = 0xec;
  local_188.m_message.px._3_1_ = 0;
  local_188.m_message.px._4_1_ = 0;
  local_188.m_message.px._5_1_ = 0;
  local_188.m_message.px._6_1_ = 0;
  local_188.m_message.px._7_1_ = 0;
  local_148[8] = false;
  local_148._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_138 = boost::unit_test::lazy_ostream::inst;
  local_1e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_1e0 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  local_130 = &local_188;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_168,(lazy_ostream *)local_148,1,0,WARN,_cVar10,
             (size_t)&local_1e8,0x56);
  boost::detail::shared_count::~shared_count(&sStack_158);
  ChaCha20::~ChaCha20(&local_c0.rng);
  local_1f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_1f0 = "";
  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x57;
  file_01.m_begin = (iterator)&local_1f8;
  msg_01.m_end = pvVar6;
  msg_01.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_208,
             msg_01);
  FastRandomContext::FastRandomContext(&local_c0,false);
  do {
    uVar3 = RandomMixin<FastRandomContext>::randbits
                      (&local_c0.super_RandomMixin<FastRandomContext>,0x20);
  } while (3599999999 < uVar3);
  local_168[0] = (class_property<bool>)(uVar3 != 0x4bc48769);
  bStack_160 = false;
  cStack_15f = 0;
  cStack_15e = 0;
  cStack_15d = 0;
  cStack_15c = 0;
  cStack_15b = 0;
  cStack_15a = 0;
  cStack_159 = 0;
  sStack_158.pi_._0_1_ = 0;
  sStack_158.pi_._1_1_ = 0;
  sStack_158.pi_._2_1_ = 0;
  sStack_158.pi_._3_1_ = 0;
  sStack_158.pi_._4_1_ = 0;
  sStack_158.pi_._5_1_ = 0;
  sStack_158.pi_._6_1_ = 0;
  sStack_158.pi_._7_1_ = 0;
  local_188.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0xa1;
  local_188._1_1_ = 0x28;
  local_188._2_1_ = 0xec;
  local_188._3_1_ = 0;
  local_188._4_1_ = 0;
  local_188._5_1_ = 0;
  local_188._6_1_ = 0;
  local_188._7_1_ = 0;
  local_188.m_message.px._0_1_ = 0xf3;
  local_188.m_message.px._1_1_ = 0x28;
  local_188.m_message.px._2_1_ = 0xec;
  local_188.m_message.px._3_1_ = 0;
  local_188.m_message.px._4_1_ = 0;
  local_188.m_message.px._5_1_ = 0;
  local_188.m_message.px._6_1_ = 0;
  local_188.m_message.px._7_1_ = 0;
  local_148[8] = false;
  local_148._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_138 = boost::unit_test::lazy_ostream::inst;
  local_130 = &local_188;
  local_218 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_210 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_168,(lazy_ostream *)local_148,1,0,WARN,_cVar10,
             (size_t)&local_218,0x57);
  boost::detail::shared_count::~shared_count(&sStack_158);
  ChaCha20::~ChaCha20(&local_c0.rng);
  local_228 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_220 = "";
  local_238 = &boost::unit_test::basic_cstring<char_const>::null;
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = &DAT_00000058;
  file_02.m_begin = (iterator)&local_228;
  msg_02.m_end = pvVar6;
  msg_02.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_238,
             msg_02);
  FastRandomContext::FastRandomContext(&local_c0,false);
  do {
    uVar3 = RandomMixin<FastRandomContext>::randbits
                      (&local_c0.super_RandomMixin<FastRandomContext>,0x16);
  } while (3599999 < uVar3);
  local_168[0] = (class_property<bool>)(uVar3 != 0x2ac74e);
  bStack_160 = false;
  cStack_15f = 0;
  cStack_15e = 0;
  cStack_15d = 0;
  cStack_15c = 0;
  cStack_15b = 0;
  cStack_15a = 0;
  cStack_159 = 0;
  sStack_158.pi_._0_1_ = 0;
  sStack_158.pi_._1_1_ = 0;
  sStack_158.pi_._2_1_ = 0;
  sStack_158.pi_._3_1_ = 0;
  sStack_158.pi_._4_1_ = 0;
  sStack_158.pi_._5_1_ = 0;
  sStack_158.pi_._6_1_ = 0;
  sStack_158.pi_._7_1_ = 0;
  local_188.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0xf4;
  local_188._1_1_ = 0x28;
  local_188._2_1_ = 0xec;
  local_188._3_1_ = 0;
  local_188._4_1_ = 0;
  local_188._5_1_ = 0;
  local_188._6_1_ = 0;
  local_188._7_1_ = 0;
  local_188.m_message.px._0_1_ = 0x43;
  local_188.m_message.px._1_1_ = 0x29;
  local_188.m_message.px._2_1_ = 0xec;
  local_188.m_message.px._3_1_ = 0;
  local_188.m_message.px._4_1_ = 0;
  local_188.m_message.px._5_1_ = 0;
  local_188.m_message.px._6_1_ = 0;
  local_188.m_message.px._7_1_ = 0;
  local_148[8] = false;
  local_148._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_138 = boost::unit_test::lazy_ostream::inst;
  local_130 = &local_188;
  local_248 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_240 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_168,(lazy_ostream *)local_148,1,0,WARN,_cVar10,
             (size_t)&local_248,0x58);
  boost::detail::shared_count::~shared_count(&sStack_158);
  ChaCha20::~ChaCha20(&local_c0.rng);
  local_258 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_250 = "";
  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x5a;
  file_03.m_begin = (iterator)&local_258;
  msg_03.m_end = pvVar6;
  msg_03.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_268,
             msg_03);
  FastRandomContext::FastRandomContext(&local_c0,false);
  uVar3 = FastRandomContext::rand64(&local_c0);
  local_168[0] = (class_property<bool>)(uVar3 != 0x8d2695759f656366);
  bStack_160 = false;
  cStack_15f = 0;
  cStack_15e = 0;
  cStack_15d = 0;
  cStack_15c = 0;
  cStack_15b = 0;
  cStack_15a = 0;
  cStack_159 = 0;
  sStack_158.pi_._0_1_ = 0;
  sStack_158.pi_._1_1_ = 0;
  sStack_158.pi_._2_1_ = 0;
  sStack_158.pi_._3_1_ = 0;
  sStack_158.pi_._4_1_ = 0;
  sStack_158.pi_._5_1_ = 0;
  sStack_158.pi_._6_1_ = 0;
  sStack_158.pi_._7_1_ = 0;
  local_188.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x44;
  local_188._1_1_ = 0x29;
  local_188._2_1_ = 0xec;
  local_188._3_1_ = 0;
  local_188._4_1_ = 0;
  local_188._5_1_ = 0;
  local_188._6_1_ = 0;
  local_188._7_1_ = 0;
  local_188.m_message.px._0_1_ = 0x8b;
  local_188.m_message.px._1_1_ = 0x29;
  local_188.m_message.px._2_1_ = 0xec;
  local_188.m_message.px._3_1_ = 0;
  local_188.m_message.px._4_1_ = 0;
  local_188.m_message.px._5_1_ = 0;
  local_188.m_message.px._6_1_ = 0;
  local_188.m_message.px._7_1_ = 0;
  local_148[8] = false;
  local_148._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_138 = boost::unit_test::lazy_ostream::inst;
  local_130 = &local_188;
  local_278 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_270 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_168,(lazy_ostream *)local_148,1,0,WARN,_cVar10,
             (size_t)&local_278,0x5a);
  boost::detail::shared_count::~shared_count(&sStack_158);
  ChaCha20::~ChaCha20(&local_c0.rng);
  local_288 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_280 = "";
  local_298 = &boost::unit_test::basic_cstring<char_const>::null;
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x5b;
  file_04.m_begin = (iterator)&local_288;
  msg_04.m_end = pvVar6;
  msg_04.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_298,
             msg_04);
  FastRandomContext::FastRandomContext(&local_c0,false);
  uVar3 = RandomMixin<FastRandomContext>::randbits<31>
                    (&local_c0.super_RandomMixin<FastRandomContext>);
  local_168[0] = (class_property<bool>)((int)uVar3 != 0x64ad5b65);
  bStack_160 = false;
  cStack_15f = 0;
  cStack_15e = 0;
  cStack_15d = 0;
  cStack_15c = 0;
  cStack_15b = 0;
  cStack_15a = 0;
  cStack_159 = 0;
  sStack_158.pi_._0_1_ = 0;
  sStack_158.pi_._1_1_ = 0;
  sStack_158.pi_._2_1_ = 0;
  sStack_158.pi_._3_1_ = 0;
  sStack_158.pi_._4_1_ = 0;
  sStack_158.pi_._5_1_ = 0;
  sStack_158.pi_._6_1_ = 0;
  sStack_158.pi_._7_1_ = 0;
  local_188.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x8c;
  local_188._1_1_ = 0x29;
  local_188._2_1_ = 0xec;
  local_188._3_1_ = 0;
  local_188._4_1_ = 0;
  local_188._5_1_ = 0;
  local_188._6_1_ = 0;
  local_188._7_1_ = 0;
  local_188.m_message.px._0_1_ = 0xbe;
  local_188.m_message.px._1_1_ = 0x29;
  local_188.m_message.px._2_1_ = 0xec;
  local_188.m_message.px._3_1_ = 0;
  local_188.m_message.px._4_1_ = 0;
  local_188.m_message.px._5_1_ = 0;
  local_188.m_message.px._6_1_ = 0;
  local_188.m_message.px._7_1_ = 0;
  local_148[8] = false;
  local_148._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_138 = boost::unit_test::lazy_ostream::inst;
  local_130 = &local_188;
  local_2a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_2a0 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_168,(lazy_ostream *)local_148,1,0,WARN,_cVar10,
             (size_t)&local_2a8,0x5b);
  boost::detail::shared_count::~shared_count(&sStack_158);
  ChaCha20::~ChaCha20(&local_c0.rng);
  local_2b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_2b0 = "";
  local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x5c;
  file_05.m_begin = (iterator)&local_2b8;
  msg_05.m_end = pvVar6;
  msg_05.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_2c8,
             msg_05);
  FastRandomContext::FastRandomContext(&local_c0,false);
  do {
    uVar3 = RandomMixin<FastRandomContext>::randbits
                      (&local_c0.super_RandomMixin<FastRandomContext>,0x20);
  } while (3599999999 < uVar3);
  local_168[0] = (class_property<bool>)(uVar3 != 0x92e77a84);
  bStack_160 = false;
  cStack_15f = 0;
  cStack_15e = 0;
  cStack_15d = 0;
  cStack_15c = 0;
  cStack_15b = 0;
  cStack_15a = 0;
  cStack_159 = 0;
  sStack_158.pi_._0_1_ = 0;
  sStack_158.pi_._1_1_ = 0;
  sStack_158.pi_._2_1_ = 0;
  sStack_158.pi_._3_1_ = 0;
  sStack_158.pi_._4_1_ = 0;
  sStack_158.pi_._5_1_ = 0;
  sStack_158.pi_._6_1_ = 0;
  sStack_158.pi_._7_1_ = 0;
  local_188.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0xbf;
  local_188._1_1_ = 0x29;
  local_188._2_1_ = 0xec;
  local_188._3_1_ = 0;
  local_188._4_1_ = 0;
  local_188._5_1_ = 0;
  local_188._6_1_ = 0;
  local_188._7_1_ = 0;
  local_188.m_message.px._0_1_ = 0x11;
  local_188.m_message.px._1_1_ = 0x2a;
  local_188.m_message.px._2_1_ = 0xec;
  local_188.m_message.px._3_1_ = 0;
  local_188.m_message.px._4_1_ = 0;
  local_188.m_message.px._5_1_ = 0;
  local_188.m_message.px._6_1_ = 0;
  local_188.m_message.px._7_1_ = 0;
  local_148[8] = false;
  local_148._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_138 = boost::unit_test::lazy_ostream::inst;
  local_130 = &local_188;
  local_2d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_2d0 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_168,(lazy_ostream *)local_148,1,0,WARN,_cVar10,
             (size_t)&local_2d8,0x5c);
  boost::detail::shared_count::~shared_count(&sStack_158);
  ChaCha20::~ChaCha20(&local_c0.rng);
  local_2e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_2e0 = "";
  local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x5d;
  file_06.m_begin = (iterator)&local_2e8;
  msg_06.m_end = pvVar6;
  msg_06.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_2f8,
             msg_06);
  FastRandomContext::FastRandomContext(&local_c0,false);
  do {
    uVar3 = RandomMixin<FastRandomContext>::randbits
                      (&local_c0.super_RandomMixin<FastRandomContext>,0x16);
  } while (3599999 < uVar3);
  local_168[0] = (class_property<bool>)(uVar3 != 0x23480d);
  bStack_160 = false;
  cStack_15f = 0;
  cStack_15e = 0;
  cStack_15d = 0;
  cStack_15c = 0;
  cStack_15b = 0;
  cStack_15a = 0;
  cStack_159 = 0;
  sStack_158.pi_._0_1_ = 0;
  sStack_158.pi_._1_1_ = 0;
  sStack_158.pi_._2_1_ = 0;
  sStack_158.pi_._3_1_ = 0;
  sStack_158.pi_._4_1_ = 0;
  sStack_158.pi_._5_1_ = 0;
  sStack_158.pi_._6_1_ = 0;
  sStack_158.pi_._7_1_ = 0;
  local_188.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x12;
  local_188._1_1_ = 0x2a;
  local_188._2_1_ = 0xec;
  local_188._3_1_ = 0;
  local_188._4_1_ = 0;
  local_188._5_1_ = 0;
  local_188._6_1_ = 0;
  local_188._7_1_ = 0;
  local_188.m_message.px._0_1_ = 0x61;
  local_188.m_message.px._1_1_ = 0x2a;
  local_188.m_message.px._2_1_ = 0xec;
  local_188.m_message.px._3_1_ = 0;
  local_188.m_message.px._4_1_ = 0;
  local_188.m_message.px._5_1_ = 0;
  local_188.m_message.px._6_1_ = 0;
  local_188.m_message.px._7_1_ = 0;
  local_148[8] = false;
  local_148._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_138 = boost::unit_test::lazy_ostream::inst;
  local_130 = &local_188;
  local_308 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_300 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_168,(lazy_ostream *)local_148,1,0,WARN,_cVar10,
             (size_t)&local_308,0x5d);
  boost::detail::shared_count::~shared_count(&sStack_158);
  ChaCha20::~ChaCha20(&local_c0.rng);
  local_318 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_310 = "";
  local_328 = &boost::unit_test::basic_cstring<char_const>::null;
  local_320 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x5f;
  file_07.m_begin = (iterator)&local_318;
  msg_07.m_end = pvVar6;
  msg_07.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_328,
             msg_07);
  FastRandomContext::FastRandomContext(&local_c0,false);
  uVar3 = FastRandomContext::rand64(&local_c0);
  local_168[0] = (class_property<bool>)(uVar3 != 0x4ef4d2cc5d4fdd77);
  bStack_160 = false;
  cStack_15f = 0;
  cStack_15e = 0;
  cStack_15d = 0;
  cStack_15c = 0;
  cStack_15b = 0;
  cStack_15a = 0;
  cStack_159 = 0;
  sStack_158.pi_._0_1_ = 0;
  sStack_158.pi_._1_1_ = 0;
  sStack_158.pi_._2_1_ = 0;
  sStack_158.pi_._3_1_ = 0;
  sStack_158.pi_._4_1_ = 0;
  sStack_158.pi_._5_1_ = 0;
  sStack_158.pi_._6_1_ = 0;
  sStack_158.pi_._7_1_ = 0;
  local_188.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x62;
  local_188._1_1_ = 0x2a;
  local_188._2_1_ = 0xec;
  local_188._3_1_ = 0;
  local_188._4_1_ = 0;
  local_188._5_1_ = 0;
  local_188._6_1_ = 0;
  local_188._7_1_ = 0;
  local_188.m_message.px._0_1_ = 0xa8;
  local_188.m_message.px._1_1_ = 0x2a;
  local_188.m_message.px._2_1_ = 0xec;
  local_188.m_message.px._3_1_ = 0;
  local_188.m_message.px._4_1_ = 0;
  local_188.m_message.px._5_1_ = 0;
  local_188.m_message.px._6_1_ = 0;
  local_188.m_message.px._7_1_ = 0;
  local_148[8] = false;
  local_148._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_138 = boost::unit_test::lazy_ostream::inst;
  local_130 = &local_188;
  local_338 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_330 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_168,(lazy_ostream *)local_148,1,0,WARN,_cVar10,
             (size_t)&local_338,0x5f);
  boost::detail::shared_count::~shared_count(&sStack_158);
  ChaCha20::~ChaCha20(&local_c0.rng);
  local_348 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_340 = "";
  local_358 = &boost::unit_test::basic_cstring<char_const>::null;
  local_350 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x60;
  file_08.m_begin = (iterator)&local_348;
  msg_08.m_end = pvVar6;
  msg_08.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_358,
             msg_08);
  FastRandomContext::FastRandomContext(&local_c0,false);
  uVar3 = RandomMixin<FastRandomContext>::randbits<31>
                    (&local_c0.super_RandomMixin<FastRandomContext>);
  local_168[0] = (class_property<bool>)((int)uVar3 != 0x2ed6f741);
  bStack_160 = false;
  cStack_15f = 0;
  cStack_15e = 0;
  cStack_15d = 0;
  cStack_15c = 0;
  cStack_15b = 0;
  cStack_15a = 0;
  cStack_159 = 0;
  sStack_158.pi_._0_1_ = 0;
  sStack_158.pi_._1_1_ = 0;
  sStack_158.pi_._2_1_ = 0;
  sStack_158.pi_._3_1_ = 0;
  sStack_158.pi_._4_1_ = 0;
  sStack_158.pi_._5_1_ = 0;
  sStack_158.pi_._6_1_ = 0;
  sStack_158.pi_._7_1_ = 0;
  local_188.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0xa9;
  local_188._1_1_ = 0x2a;
  local_188._2_1_ = 0xec;
  local_188._3_1_ = 0;
  local_188._4_1_ = 0;
  local_188._5_1_ = 0;
  local_188._6_1_ = 0;
  local_188._7_1_ = 0;
  local_188.m_message.px._0_1_ = 0xda;
  local_188.m_message.px._1_1_ = 0x2a;
  local_188.m_message.px._2_1_ = 0xec;
  local_188.m_message.px._3_1_ = 0;
  local_188.m_message.px._4_1_ = 0;
  local_188.m_message.px._5_1_ = 0;
  local_188.m_message.px._6_1_ = 0;
  local_188.m_message.px._7_1_ = 0;
  local_148[8] = false;
  local_148._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_138 = boost::unit_test::lazy_ostream::inst;
  local_130 = &local_188;
  local_368 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_360 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_168,(lazy_ostream *)local_148,1,0,WARN,_cVar10,
             (size_t)&local_368,0x60);
  boost::detail::shared_count::~shared_count(&sStack_158);
  ChaCha20::~ChaCha20(&local_c0.rng);
  local_378 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_370 = "";
  local_388 = &boost::unit_test::basic_cstring<char_const>::null;
  local_380 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x61;
  file_09.m_begin = (iterator)&local_378;
  msg_09.m_end = pvVar6;
  msg_09.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_388,
             msg_09);
  FastRandomContext::FastRandomContext(&local_c0,false);
  do {
    uVar3 = RandomMixin<FastRandomContext>::randbits
                      (&local_c0.super_RandomMixin<FastRandomContext>,0x20);
  } while (3599999999 < uVar3);
  local_168[0] = (class_property<bool>)(uVar3 != 0x5939814);
  bStack_160 = false;
  cStack_15f = 0;
  cStack_15e = 0;
  cStack_15d = 0;
  cStack_15c = 0;
  cStack_15b = 0;
  cStack_15a = 0;
  cStack_159 = 0;
  sStack_158.pi_._0_1_ = 0;
  sStack_158.pi_._1_1_ = 0;
  sStack_158.pi_._2_1_ = 0;
  sStack_158.pi_._3_1_ = 0;
  sStack_158.pi_._4_1_ = 0;
  sStack_158.pi_._5_1_ = 0;
  sStack_158.pi_._6_1_ = 0;
  sStack_158.pi_._7_1_ = 0;
  local_188.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0xdb;
  local_188._1_1_ = 0x2a;
  local_188._2_1_ = 0xec;
  local_188._3_1_ = 0;
  local_188._4_1_ = 0;
  local_188._5_1_ = 0;
  local_188._6_1_ = 0;
  local_188._7_1_ = 0;
  local_188.m_message.px._0_1_ = 0x2b;
  local_188.m_message.px._1_1_ = 0x2b;
  local_188.m_message.px._2_1_ = 0xec;
  local_188.m_message.px._3_1_ = 0;
  local_188.m_message.px._4_1_ = 0;
  local_188.m_message.px._5_1_ = 0;
  local_188.m_message.px._6_1_ = 0;
  local_188.m_message.px._7_1_ = 0;
  local_148[8] = false;
  local_148._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_138 = boost::unit_test::lazy_ostream::inst;
  local_130 = &local_188;
  local_398 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_390 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_168,(lazy_ostream *)local_148,1,0,WARN,_cVar10,
             (size_t)&local_398,0x61);
  boost::detail::shared_count::~shared_count(&sStack_158);
  ChaCha20::~ChaCha20(&local_c0.rng);
  local_3a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_3a0 = "";
  local_3b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x62;
  file_10.m_begin = (iterator)&local_3a8;
  msg_10.m_end = pvVar6;
  msg_10.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_3b8,
             msg_10);
  FastRandomContext::FastRandomContext(&local_c0,false);
  do {
    uVar3 = RandomMixin<FastRandomContext>::randbits
                      (&local_c0.super_RandomMixin<FastRandomContext>,0x16);
  } while (3599999 < uVar3);
  local_168[0] = (class_property<bool>)(uVar3 != 0x7bc8e);
  bStack_160 = false;
  cStack_15f = 0;
  cStack_15e = 0;
  cStack_15d = 0;
  cStack_15c = 0;
  cStack_15b = 0;
  cStack_15a = 0;
  cStack_159 = 0;
  sStack_158.pi_._0_1_ = 0;
  sStack_158.pi_._1_1_ = 0;
  sStack_158.pi_._2_1_ = 0;
  sStack_158.pi_._3_1_ = 0;
  sStack_158.pi_._4_1_ = 0;
  sStack_158.pi_._5_1_ = 0;
  sStack_158.pi_._6_1_ = 0;
  sStack_158.pi_._7_1_ = 0;
  local_188.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x2c;
  local_188._1_1_ = 0x2b;
  local_188._2_1_ = 0xec;
  local_188._3_1_ = 0;
  local_188._4_1_ = 0;
  local_188._5_1_ = 0;
  local_188._6_1_ = 0;
  local_188._7_1_ = 0;
  local_188.m_message.px._0_1_ = 0x7a;
  local_188.m_message.px._1_1_ = 0x2b;
  local_188.m_message.px._2_1_ = 0xec;
  local_188.m_message.px._3_1_ = 0;
  local_188.m_message.px._4_1_ = 0;
  local_188.m_message.px._5_1_ = 0;
  local_188.m_message.px._6_1_ = 0;
  local_188.m_message.px._7_1_ = 0;
  local_148[8] = false;
  local_148._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_138 = boost::unit_test::lazy_ostream::inst;
  local_130 = &local_188;
  local_3c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_3c0 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_168,(lazy_ostream *)local_148,1,0,WARN,_cVar10,
             (size_t)&local_3c8,0x62);
  boost::detail::shared_count::~shared_count(&sStack_158);
  ChaCha20::~ChaCha20(&local_c0.rng);
  FastRandomContext::FastRandomContext(&local_c0,false);
  FastRandomContext::FastRandomContext((FastRandomContext *)local_148,false);
  local_3d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_3d0 = "";
  local_3e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0x67;
  file_11.m_begin = (iterator)&local_3d8;
  msg_11.m_end = pvVar6;
  msg_11.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_3e8,
             msg_11);
  uVar3 = FastRandomContext::rand64(&local_c0);
  uVar4 = FastRandomContext::rand64((FastRandomContext *)local_148);
  local_188.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(uVar3 != uVar4);
  local_188.m_message.px._0_1_ = 0;
  local_188.m_message.px._1_1_ = 0;
  local_188.m_message.px._2_1_ = 0;
  local_188.m_message.px._3_1_ = 0;
  local_188.m_message.px._4_1_ = 0;
  local_188.m_message.px._5_1_ = 0;
  local_188.m_message.px._6_1_ = 0;
  local_188.m_message.px._7_1_ = 0;
  local_188.m_message.pn.pi_._0_1_ = 0;
  local_188.m_message.pn.pi_._1_1_ = 0;
  local_188.m_message.pn.pi_._2_1_ = 0;
  local_188.m_message.pn.pi_._3_1_ = 0;
  local_188.m_message.pn.pi_._4_1_ = 0;
  local_188.m_message.pn.pi_._5_1_ = 0;
  local_188.m_message.pn.pi_._6_1_ = 0;
  local_188.m_message.pn.pi_._7_1_ = 0;
  local_450.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = "ctx3.rand64() != ctx4.rand64()";
  local_450.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = "";
  bStack_160 = false;
  local_168[0] = (class_property<bool>)0xc8;
  local_168[1] = 0xe1;
  local_168[2] = 0x3a;
  local_168[3] = 1;
  local_168[4] = 0;
  local_168[5] = 0;
  local_168[6] = 0;
  local_168[7] = 0;
  sStack_158.pi_._0_1_ = 0x38;
  sStack_158.pi_._1_1_ = 0x21;
  sStack_158.pi_._2_1_ = 0x3c;
  sStack_158.pi_._3_1_ = 1;
  sStack_158.pi_._4_1_ = 0;
  sStack_158.pi_._5_1_ = 0;
  sStack_158.pi_._6_1_ = 0;
  sStack_158.pi_._7_1_ = 0;
  cStack_150 = (char)&local_450;
  cStack_14f = (char)((ulong)&local_450 >> 8);
  cStack_14e = (char)((ulong)&local_450 >> 0x10);
  cStack_14d = (char)((ulong)&local_450 >> 0x18);
  cStack_14c = (char)((ulong)&local_450 >> 0x20);
  cStack_14b = (char)((ulong)&local_450 >> 0x28);
  cStack_14a = (char)((ulong)&local_450 >> 0x30);
  cStack_149 = (char)((ulong)&local_450 >> 0x38);
  local_3f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_3f0 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_188,(lazy_ostream *)local_168,1,0,WARN,_cVar10,(size_t)&local_3f8,0x67);
  boost::detail::shared_count::~shared_count(&local_188.m_message.pn);
  ChaCha20::~ChaCha20((ChaCha20 *)&local_138);
  ChaCha20::~ChaCha20(&local_c0.rng);
  FastRandomContext::FastRandomContext(&local_c0,false);
  FastRandomContext::FastRandomContext((FastRandomContext *)local_148,false);
  local_408 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_400 = "";
  local_418 = &boost::unit_test::basic_cstring<char_const>::null;
  local_410 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0x6b;
  file_12.m_begin = (iterator)&local_408;
  msg_12.m_end = pvVar6;
  msg_12.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_418,
             msg_12);
  sStack_158.pi_._0_1_ = '\0';
  sStack_158.pi_._1_1_ = '\0';
  sStack_158.pi_._2_1_ = '\0';
  sStack_158.pi_._3_1_ = '\0';
  sStack_158.pi_._4_1_ = '\0';
  sStack_158.pi_._5_1_ = '\0';
  sStack_158.pi_._6_1_ = '\0';
  sStack_158.pi_._7_1_ = '\0';
  cStack_150 = '\0';
  cStack_14f = '\0';
  cStack_14e = '\0';
  cStack_14d = '\0';
  cStack_14c = '\0';
  cStack_14b = '\0';
  cStack_14a = '\0';
  cStack_149 = '\0';
  local_168[0] = (class_property<bool>)0x0;
  local_168[1] = '\0';
  local_168[2] = '\0';
  local_168[3] = '\0';
  local_168[4] = '\0';
  local_168[5] = '\0';
  local_168[6] = '\0';
  local_168[7] = '\0';
  bStack_160 = false;
  cStack_15f = '\0';
  cStack_15e = '\0';
  cStack_15d = '\0';
  cStack_15c = '\0';
  cStack_15b = '\0';
  cStack_15a = '\0';
  cStack_159 = '\0';
  output.m_size = 0x20;
  output.m_data = local_168;
  FastRandomContext::fillrand(&local_c0,output);
  local_188.m_message.pn.pi_._0_1_ = '\0';
  local_188.m_message.pn.pi_._1_1_ = '\0';
  local_188.m_message.pn.pi_._2_1_ = '\0';
  local_188.m_message.pn.pi_._3_1_ = '\0';
  local_188.m_message.pn.pi_._4_1_ = '\0';
  local_188.m_message.pn.pi_._5_1_ = '\0';
  local_188.m_message.pn.pi_._6_1_ = '\0';
  local_188.m_message.pn.pi_._7_1_ = '\0';
  cStack_170 = '\0';
  cStack_16f = '\0';
  cStack_16e = '\0';
  cStack_16d = '\0';
  cStack_16c = '\0';
  cStack_16b = '\0';
  cStack_16a = '\0';
  cStack_169 = '\0';
  local_188.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x0;
  local_188._1_1_ = '\0';
  local_188._2_1_ = '\0';
  local_188._3_1_ = '\0';
  local_188._4_1_ = '\0';
  local_188._5_1_ = '\0';
  local_188._6_1_ = '\0';
  local_188._7_1_ = '\0';
  local_188.m_message.px._0_1_ = '\0';
  local_188.m_message.px._1_1_ = '\0';
  local_188.m_message.px._2_1_ = '\0';
  local_188.m_message.px._3_1_ = '\0';
  local_188.m_message.px._4_1_ = '\0';
  local_188.m_message.px._5_1_ = '\0';
  local_188.m_message.px._6_1_ = '\0';
  local_188.m_message.px._7_1_ = '\0';
  output_00.m_size = 0x20;
  output_00.m_data = (byte *)&local_188;
  FastRandomContext::fillrand((FastRandomContext *)local_148,output_00);
  auVar9[0] = -((char)sStack_158.pi_ == (char)local_188.m_message.pn.pi_);
  auVar9[1] = -(sStack_158.pi_._1_1_ == local_188.m_message.pn.pi_._1_1_);
  auVar9[2] = -(sStack_158.pi_._2_1_ == local_188.m_message.pn.pi_._2_1_);
  auVar9[3] = -(sStack_158.pi_._3_1_ == local_188.m_message.pn.pi_._3_1_);
  auVar9[4] = -(sStack_158.pi_._4_1_ == local_188.m_message.pn.pi_._4_1_);
  auVar9[5] = -(sStack_158.pi_._5_1_ == local_188.m_message.pn.pi_._5_1_);
  auVar9[6] = -(sStack_158.pi_._6_1_ == local_188.m_message.pn.pi_._6_1_);
  auVar9[7] = -(sStack_158.pi_._7_1_ == local_188.m_message.pn.pi_._7_1_);
  auVar9[8] = -(cStack_150 == cStack_170);
  auVar9[9] = -(cStack_14f == cStack_16f);
  auVar9[10] = -(cStack_14e == cStack_16e);
  auVar9[0xb] = -(cStack_14d == cStack_16d);
  auVar9[0xc] = -(cStack_14c == cStack_16c);
  auVar9[0xd] = -(cStack_14b == cStack_16b);
  auVar9[0xe] = -(cStack_14a == cStack_16a);
  auVar9[0xf] = -(cStack_149 == cStack_169);
  auVar8[0] = -((readonly_property<bool>)local_168[0] ==
               local_188.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.
               value);
  auVar8[1] = -(local_168[1] == local_188._1_1_);
  auVar8[2] = -(local_168[2] == local_188._2_1_);
  auVar8[3] = -(local_168[3] == local_188._3_1_);
  auVar8[4] = -(local_168[4] == local_188._4_1_);
  auVar8[5] = -(local_168[5] == local_188._5_1_);
  auVar8[6] = -(local_168[6] == local_188._6_1_);
  auVar8[7] = -(local_168[7] == local_188._7_1_);
  auVar8[8] = -(bStack_160 == (bool)(char)local_188.m_message.px);
  auVar8[9] = -(cStack_15f == local_188.m_message.px._1_1_);
  auVar8[10] = -(cStack_15e == local_188.m_message.px._2_1_);
  auVar8[0xb] = -(cStack_15d == local_188.m_message.px._3_1_);
  auVar8[0xc] = -(cStack_15c == local_188.m_message.px._4_1_);
  auVar8[0xd] = -(cStack_15b == local_188.m_message.px._5_1_);
  auVar8[0xe] = -(cStack_15a == local_188.m_message.px._6_1_);
  auVar8[0xf] = -(cStack_159 == local_188.m_message.px._7_1_);
  auVar8 = auVar8 & auVar9;
  local_430.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       ((ushort)((ushort)(SUB161(auVar8 >> 7,0) & 1) | (ushort)(SUB161(auVar8 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar8 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar8 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar8 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar8 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar8 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar8 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar8 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar8 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar8 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar8 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar8 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar8 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar8 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar8[0xf] >> 7) << 0xf) != 0xffff);
  local_430.m_message.px = (element_type *)0x0;
  local_430.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_460 = "ctx3.rand256() != ctx4.rand256()";
  local_458 = "";
  local_450.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)local_450.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  local_450.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013ae1c8;
  local_450.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
  local_470 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_468 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  local_438 = &local_460;
  boost::test_tools::tt_detail::report_assertion
            (&local_430,(lazy_ostream *)&local_450,1,0,WARN,_cVar10,(size_t)&local_470,0x6b);
  boost::detail::shared_count::~shared_count(&local_430.m_message.pn);
  ChaCha20::~ChaCha20((ChaCha20 *)&local_138);
  ChaCha20::~ChaCha20(&local_c0.rng);
  FastRandomContext::FastRandomContext(&local_c0,false);
  FastRandomContext::FastRandomContext((FastRandomContext *)local_148,false);
  local_480 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_478 = "";
  local_490 = &boost::unit_test::basic_cstring<char_const>::null;
  local_488 = &boost::unit_test::basic_cstring<char_const>::null;
  file_13.m_end = (iterator)0x6f;
  file_13.m_begin = (iterator)&local_480;
  msg_13.m_end = pvVar6;
  msg_13.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_490,
             msg_13);
  RandomMixin<FastRandomContext>::randbytes<unsigned_char>
            (&local_450,&local_c0.super_RandomMixin<FastRandomContext>,7);
  RandomMixin<FastRandomContext>::randbytes<unsigned_char>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_430,
             (RandomMixin<FastRandomContext> *)local_148,7);
  rVar7.super_class_property<bool>.value = (class_property<bool>)true;
  if ((long)local_450.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_450.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start ==
      (long)local_430.m_message.px -
      (long)CONCAT71(local_430._1_7_,
                     local_430.p_predicate_value.super_readonly_property<bool>.
                     super_class_property<bool>.value)) {
    if (local_450.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_450.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start) {
      rVar7.super_class_property<bool>.value = (class_property<bool>)false;
    }
    else {
      iVar2 = bcmp(local_450.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   (void *)CONCAT71(local_430._1_7_,
                                    local_430.p_predicate_value.super_readonly_property<bool>.
                                    super_class_property<bool>.value),
                   (long)local_450.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_450.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_start);
      rVar7.super_class_property<bool>.value = (class_property<bool>)(iVar2 != 0);
    }
  }
  local_188.m_message.px._0_1_ = 0;
  local_188.m_message.px._1_1_ = 0;
  local_188.m_message.px._2_1_ = 0;
  local_188.m_message.px._3_1_ = 0;
  local_188.m_message.px._4_1_ = 0;
  local_188.m_message.px._5_1_ = 0;
  local_188.m_message.px._6_1_ = 0;
  local_188.m_message.px._7_1_ = 0;
  local_188.m_message.pn.pi_._0_1_ = 0;
  local_188.m_message.pn.pi_._1_1_ = 0;
  local_188.m_message.pn.pi_._2_1_ = 0;
  local_188.m_message.pn.pi_._3_1_ = 0;
  local_188.m_message.pn.pi_._4_1_ = 0;
  local_188.m_message.pn.pi_._5_1_ = 0;
  local_188.m_message.pn.pi_._6_1_ = 0;
  local_188.m_message.pn.pi_._7_1_ = 0;
  local_460 = "ctx3.randbytes(7) != ctx4.randbytes(7)";
  local_458 = "";
  bStack_160 = false;
  local_168[0] = (class_property<bool>)0xc8;
  local_168[1] = 0xe1;
  local_168[2] = 0x3a;
  local_168[3] = 1;
  local_168[4] = 0;
  local_168[5] = 0;
  local_168[6] = 0;
  local_168[7] = 0;
  sStack_158.pi_._0_1_ = 0x38;
  sStack_158.pi_._1_1_ = 0x21;
  sStack_158.pi_._2_1_ = 0x3c;
  sStack_158.pi_._3_1_ = 1;
  sStack_158.pi_._4_1_ = 0;
  sStack_158.pi_._5_1_ = 0;
  sStack_158.pi_._6_1_ = 0;
  sStack_158.pi_._7_1_ = 0;
  cStack_150 = (char)&local_460;
  cStack_14f = (char)((ulong)&local_460 >> 8);
  cStack_14e = (char)((ulong)&local_460 >> 0x10);
  cStack_14d = (char)((ulong)&local_460 >> 0x18);
  cStack_14c = (char)((ulong)&local_460 >> 0x20);
  cStack_14b = (char)((ulong)&local_460 >> 0x28);
  cStack_14a = (char)((ulong)&local_460 >> 0x30);
  cStack_149 = (char)((ulong)&local_460 >> 0x38);
  local_188.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)rVar7.super_class_property<bool>.value;
  boost::test_tools::tt_detail::report_assertion
            (&local_188,(lazy_ostream *)local_168,1,0,WARN,0xec2328,(size_t)&stack0xfffffffffffffb60
             ,0x6f);
  boost::detail::shared_count::~shared_count(&local_188.m_message.pn);
  pvVar1 = (void *)CONCAT71(local_430._1_7_,
                            local_430.p_predicate_value.super_readonly_property<bool>.
                            super_class_property<bool>.value);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,(long)local_430.m_message.pn.pi_ - (long)pvVar1);
  }
  if ((_func_int **)
      local_450.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (_func_int **)0x0) {
    operator_delete(local_450.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_450.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_450.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  ChaCha20::~ChaCha20((ChaCha20 *)&local_138);
  ChaCha20::~ChaCha20(&local_c0.rng);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(fastrandom_tests_nondeterministic)
{
    // Check that a nondeterministic ones are not
    {
        BOOST_CHECK(FastRandomContext().rand<uint64_t>() != uint64_t{9330418229102544152u});
        BOOST_CHECK(FastRandomContext().rand<int>() != int{618925161});
        BOOST_CHECK(FastRandomContext().randrange<std::chrono::microseconds>(1h).count() != 1271170921);
        BOOST_CHECK(FastRandomContext().randrange<std::chrono::milliseconds>(1h).count() != 2803534);

        BOOST_CHECK(FastRandomContext().rand<uint64_t>() != uint64_t{10170981140880778086u});
        BOOST_CHECK(FastRandomContext().rand<int>() != int{1689082725});
        BOOST_CHECK(FastRandomContext().randrange<std::chrono::microseconds>(1h).count() != 2464643716);
        BOOST_CHECK(FastRandomContext().randrange<std::chrono::milliseconds>(1h).count() != 2312205);

        BOOST_CHECK(FastRandomContext().rand<uint64_t>() != uint64_t{5689404004456455543u});
        BOOST_CHECK(FastRandomContext().rand<int>() != int{785839937});
        BOOST_CHECK(FastRandomContext().randrange<std::chrono::microseconds>(1h).count() != 93558804);
        BOOST_CHECK(FastRandomContext().randrange<std::chrono::milliseconds>(1h).count() != 507022);
    }

    {
        FastRandomContext ctx3, ctx4;
        BOOST_CHECK(ctx3.rand64() != ctx4.rand64()); // extremely unlikely to be equal
    }
    {
        FastRandomContext ctx3, ctx4;
        BOOST_CHECK(ctx3.rand256() != ctx4.rand256());
    }
    {
        FastRandomContext ctx3, ctx4;
        BOOST_CHECK(ctx3.randbytes(7) != ctx4.randbytes(7));
    }
}